

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue-105-verbose-combination-errors.cpp
# Opt level: O2

void anon_unknown.dwarf_2d628::verboseTest(string *first_combination,string *second_combination)

{
  bool bVar1;
  ostream *poVar2;
  MyErrorHandler *this;
  long lVar3;
  pointer pEVar4;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_00;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_01;
  initializer_list_t init_02;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_03;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_04;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_05;
  initializer_list_t init_06;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_07;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_08;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_09;
  initializer_list_t init_10;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_11;
  initializer_list_t init_12;
  initializer_list<nlohmann::json_abi_v3_11_2::detail::json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_13;
  initializer_list_t init_14;
  undefined1 auStack_6d8 [48];
  MyErrorHandler error_handler;
  MyErrorHandler error_handler_3;
  string local_658;
  string local_638;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_618;
  json schema;
  int local_5f4;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  generateSchema((anon_unknown_dwarf_2d628 *)&schema,first_combination,second_combination);
  error_handler.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__MyErrorHandler_00162180;
  error_handler.m_error_list.
  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  error_handler.m_error_list.
  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  error_handler.m_error_list.
  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>
            ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)auStack_6d8,(char (*) [6])0x1414b4);
  nlohmann::json_abi_v3_11_2::detail::
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[7],_0>
            ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&error_handler_3,(char (*) [7])0x141525);
  local_5f4 = 1;
  nlohmann::json_abi_v3_11_2::detail::
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<int,_0>((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&error_handler_3.m_error_list.
                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f4);
  init._M_len = 2;
  init._M_array = (iterator)&error_handler_3;
  nlohmann::json_abi_v3_11_2::detail::
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_638,init);
  init_00._M_len = 1;
  init_00._M_array = (iterator)&local_638;
  nlohmann::json_abi_v3_11_2::detail::
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)(auStack_6d8 + 0x18),init_00);
  init_01._M_len = 2;
  init_01._M_array = (iterator)auStack_6d8;
  nlohmann::json_abi_v3_11_2::detail::
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_658,init_01);
  init_02._M_len = 1;
  init_02._M_array = (iterator)&local_658;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_618,init_02,true,array);
  validate(&schema,&local_618,&error_handler.super_error_handler);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_618);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_658);
  lVar3 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(auStack_6d8 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_638);
  lVar3 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)((long)&error_handler_3.super_error_handler._vptr_error_handler + lVar3));
    pEVar4 = error_handler.m_error_list.
             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if ((long)error_handler.m_error_list.
            super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)error_handler.m_error_list.
            super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x1b0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&error_handler_3,(string_t *)auStack_6d8);
    bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                      (&pEVar4->ptr,
                       (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&error_handler_3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&error_handler_3);
    std::__cxx11::string::~string((string *)auStack_6d8);
    pEVar4 = error_handler.m_error_list.
             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc5);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"The two values of ");
      poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                         (poVar2,&(error_handler.m_error_list.
                                   super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->ptr);
      poVar2 = std::operator<<(poVar2," (error_list[0].ptr");
      poVar2 = std::operator<<(poVar2,") and ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&error_handler_3,(string_t *)auStack_6d8);
      poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                         (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&error_handler_3);
      poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first\"}");
      poVar2 = std::operator<<(poVar2,") should be equal");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      rootError((string *)&error_handler_3,first_combination,3);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &error_handler_3,0x10);
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (&pEVar4->message,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
      std::__cxx11::string::~string((string *)&error_handler_3);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc6);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,"String \"");
        poVar2 = std::operator<<(poVar2,(string *)
                                        &(error_handler.m_error_list.
                                          super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->message);
        poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
        rootError((string *)auStack_6d8,first_combination,3);
        poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
        poVar2 = std::operator<<(poVar2,"\"");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)auStack_6d8);
        (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
      }
      pEVar4 = error_handler.m_error_list.
               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&error_handler_3,(string_t *)auStack_6d8);
      bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                        (&pEVar4[1].ptr,
                         (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&error_handler_3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&error_handler_3);
      std::__cxx11::string::~string((string *)auStack_6d8);
      pEVar4 = error_handler.m_error_list.
               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,200);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,"The two values of ");
        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                           (poVar2,&error_handler.m_error_list.
                                    super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].ptr);
        poVar2 = std::operator<<(poVar2," (error_list[1].ptr");
        poVar2 = std::operator<<(poVar2,") and ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
        nlohmann::json_abi_v3_11_2::
        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&error_handler_3,(string_t *)auStack_6d8);
        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                           (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&error_handler_3);
        poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first/second\"}");
        poVar2 = std::operator<<(poVar2,") should be equal");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        combinationError(&local_50,first_combination,0);
        rootError(&local_658,second_combination,2);
        operator<<((string *)&error_handler_3,&local_50,&local_658);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &error_handler_3,0x10);
        bVar1 = std::
                regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&pEVar4[1].message,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
        std::__cxx11::string::~string((string *)&error_handler_3);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc9);
          poVar2 = std::operator<<(poVar2,": ");
          poVar2 = std::operator<<(poVar2,"String \"");
          poVar2 = std::operator<<(poVar2,(string *)
                                          &error_handler.m_error_list.
                                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].message);
          poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
          combinationError(&local_70,first_combination,0);
          rootError((string *)&error_handler_3,second_combination,2);
          operator<<((string *)auStack_6d8,&local_70,(string *)&error_handler_3);
          poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
          poVar2 = std::operator<<(poVar2,"\"");
          std::endl<char,std::char_traits<char>>(poVar2);
          std::__cxx11::string::~string((string *)auStack_6d8);
          std::__cxx11::string::~string((string *)&error_handler_3);
          std::__cxx11::string::~string((string *)&local_70);
          (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
        }
        pEVar4 = error_handler.m_error_list.
                 super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
        nlohmann::json_abi_v3_11_2::
        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&error_handler_3,(string_t *)auStack_6d8);
        bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                          (&pEVar4->ptr,
                           (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&error_handler_3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error_handler_3);
        std::__cxx11::string::~string((string *)auStack_6d8);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xcb);
          poVar2 = std::operator<<(poVar2,": ");
          poVar2 = std::operator<<(poVar2,"The two values of ");
          poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                             (poVar2,&error_handler.m_error_list.
                                      super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2].ptr);
          poVar2 = std::operator<<(poVar2," (error_list[2].ptr");
          poVar2 = std::operator<<(poVar2,") and ");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
          nlohmann::json_abi_v3_11_2::
          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error_handler_3,(string_t *)auStack_6d8);
          poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                             (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&error_handler_3);
          poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first/second\"}");
          poVar2 = std::operator<<(poVar2,") should be equal");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else {
          pEVar4 = error_handler.m_error_list.
                   super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
          combinationError(&local_b0,first_combination,0);
          combinationError(&local_658,second_combination,0);
          operator<<(&local_90,&local_b0,&local_658);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_638,"instance is below minimum of 5",
                     (allocator<char> *)&local_618);
          operator<<((string *)&error_handler_3,&local_90,&local_638);
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &error_handler_3,0x10);
          bVar1 = std::
                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (&pEVar4->message,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
          std::__cxx11::string::~string((string *)&error_handler_3);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_658);
          std::__cxx11::string::~string((string *)&local_b0);
          if (!bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xcc);
            poVar2 = std::operator<<(poVar2,": ");
            poVar2 = std::operator<<(poVar2,"String \"");
            poVar2 = std::operator<<(poVar2,(string *)
                                            &error_handler.m_error_list.
                                             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].message);
            poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
            combinationError(&local_f0,first_combination,0);
            combinationError((string *)&error_handler_3,second_combination,0);
            operator<<(&local_d0,&local_f0,(string *)&error_handler_3);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_658,"instance is below minimum of 5",
                       (allocator<char> *)&local_638);
            operator<<((string *)auStack_6d8,&local_d0,&local_658);
            poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
            poVar2 = std::operator<<(poVar2,"\"");
            std::endl<char,std::char_traits<char>>(poVar2);
            std::__cxx11::string::~string((string *)auStack_6d8);
            std::__cxx11::string::~string((string *)&local_658);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&error_handler_3);
            std::__cxx11::string::~string((string *)&local_f0);
            (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
          }
          pEVar4 = error_handler.m_error_list.
                   super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start + 3;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
          nlohmann::json_abi_v3_11_2::
          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error_handler_3,(string_t *)auStack_6d8);
          bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                            (&pEVar4->ptr,
                             (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&error_handler_3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error_handler_3);
          std::__cxx11::string::~string((string *)auStack_6d8);
          if (bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xce);
            poVar2 = std::operator<<(poVar2,": ");
            poVar2 = std::operator<<(poVar2,"The two values of ");
            poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                               (poVar2,&error_handler.m_error_list.
                                        super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start[3].ptr);
            poVar2 = std::operator<<(poVar2," (error_list[3].ptr");
            poVar2 = std::operator<<(poVar2,") and ");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
            nlohmann::json_abi_v3_11_2::
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error_handler_3,(string_t *)auStack_6d8);
            poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                               (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&error_handler_3);
            poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first/second\"}");
            poVar2 = std::operator<<(poVar2,") should be equal");
            std::endl<char,std::char_traits<char>>(poVar2);
          }
          else {
            pEVar4 = error_handler.m_error_list.
                     super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3;
            combinationError(&local_130,first_combination,0);
            combinationError(&local_658,second_combination,1);
            operator<<(&local_110,&local_130,&local_658);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_638,"instance is not a multiple of 2.0",
                       (allocator<char> *)&local_618);
            operator<<((string *)&error_handler_3,&local_110,&local_638);
            std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
            basic_regex<std::char_traits<char>,std::allocator<char>>
                      ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &error_handler_3,0x10);
            bVar1 = std::
                    regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              (&pEVar4->message,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8,0
                              );
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
            std::__cxx11::string::~string((string *)&error_handler_3);
            std::__cxx11::string::~string((string *)&local_638);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_658);
            std::__cxx11::string::~string((string *)&local_130);
            if (!bVar1) {
              poVar2 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xcf);
              poVar2 = std::operator<<(poVar2,": ");
              poVar2 = std::operator<<(poVar2,"String \"");
              poVar2 = std::operator<<(poVar2,(string *)
                                              &error_handler.m_error_list.
                                               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start[3].message)
              ;
              poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
              combinationError(&local_170,first_combination,0);
              combinationError((string *)&error_handler_3,second_combination,1);
              operator<<(&local_150,&local_170,(string *)&error_handler_3);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_658,"instance is not a multiple of 2.0",
                         (allocator<char> *)&local_638);
              operator<<((string *)auStack_6d8,&local_150,&local_658);
              poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
              poVar2 = std::operator<<(poVar2,"\"");
              std::endl<char,std::char_traits<char>>(poVar2);
              std::__cxx11::string::~string((string *)auStack_6d8);
              std::__cxx11::string::~string((string *)&local_658);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&error_handler_3);
              std::__cxx11::string::~string((string *)&local_170);
              (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
            }
            pEVar4 = error_handler.m_error_list.
                     super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
            nlohmann::json_abi_v3_11_2::
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error_handler_3,(string_t *)auStack_6d8);
            bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                              (&pEVar4->ptr,
                               (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&error_handler_3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error_handler_3);
            std::__cxx11::string::~string((string *)auStack_6d8);
            if (bVar1) {
              poVar2 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xd1);
              poVar2 = std::operator<<(poVar2,": ");
              poVar2 = std::operator<<(poVar2,"The two values of ");
              poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                 (poVar2,&error_handler.m_error_list.
                                          super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_start[4].ptr);
              poVar2 = std::operator<<(poVar2," (error_list[4].ptr");
              poVar2 = std::operator<<(poVar2,") and ");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
              nlohmann::json_abi_v3_11_2::
              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error_handler_3,(string_t *)auStack_6d8);
              poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                 (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&error_handler_3);
              poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first\"}");
              poVar2 = std::operator<<(poVar2,") should be equal");
              std::endl<char,std::char_traits<char>>(poVar2);
            }
            else {
              pEVar4 = error_handler.m_error_list.
                       super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4;
              combinationError(&local_190,first_combination,1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_658,"unexpected instance type",
                         (allocator<char> *)&local_638);
              operator<<((string *)&error_handler_3,&local_190,&local_658);
              std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
              basic_regex<std::char_traits<char>,std::allocator<char>>
                        ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &error_handler_3,0x10);
              bVar1 = std::
                      regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                (&pEVar4->message,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8
                                 ,0);
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
              std::__cxx11::string::~string((string *)&error_handler_3);
              std::__cxx11::string::~string((string *)&local_658);
              std::__cxx11::string::~string((string *)&local_190);
              if (!bVar1) {
                poVar2 = std::operator<<((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                        );
                poVar2 = std::operator<<(poVar2,":");
                poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xd2);
                poVar2 = std::operator<<(poVar2,": ");
                poVar2 = std::operator<<(poVar2,"String \"");
                poVar2 = std::operator<<(poVar2,(string *)
                                                &error_handler.m_error_list.
                                                 super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[4].
                                                 message);
                poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                combinationError(&local_1b0,first_combination,1);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&error_handler_3,"unexpected instance type",
                           (allocator<char> *)&local_658);
                operator<<((string *)auStack_6d8,&local_1b0,(string *)&error_handler_3);
                poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                poVar2 = std::operator<<(poVar2,"\"");
                std::endl<char,std::char_traits<char>>(poVar2);
                std::__cxx11::string::~string((string *)auStack_6d8);
                std::__cxx11::string::~string((string *)&error_handler_3);
                std::__cxx11::string::~string((string *)&local_1b0);
                (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
              }
              pEVar4 = error_handler.m_error_list.
                       super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
              nlohmann::json_abi_v3_11_2::
              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error_handler_3,(string_t *)auStack_6d8);
              bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                (&pEVar4->ptr,
                                 (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&error_handler_3);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&error_handler_3);
              std::__cxx11::string::~string((string *)auStack_6d8);
              if (bVar1) {
                poVar2 = std::operator<<((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                        );
                poVar2 = std::operator<<(poVar2,":");
                poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xd4);
                poVar2 = std::operator<<(poVar2,": ");
                poVar2 = std::operator<<(poVar2,"The two values of ");
                poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                   (poVar2,&error_handler.m_error_list.
                                            super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_start[5].ptr);
                poVar2 = std::operator<<(poVar2," (error_list[5].ptr");
                poVar2 = std::operator<<(poVar2,") and ");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
                nlohmann::json_abi_v3_11_2::
                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&error_handler_3,(string_t *)auStack_6d8);
                poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                   (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&error_handler_3);
                poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first\"}");
                poVar2 = std::operator<<(poVar2,") should be equal");
                std::endl<char,std::char_traits<char>>(poVar2);
              }
              else {
                pEVar4 = error_handler.m_error_list.
                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start + 5;
                combinationError(&local_1d0,first_combination,2);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_658,"unexpected instance type",
                           (allocator<char> *)&local_638);
                operator<<((string *)&error_handler_3,&local_1d0,&local_658);
                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                basic_regex<std::char_traits<char>,std::allocator<char>>
                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &error_handler_3,0x10);
                bVar1 = std::
                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                  (&pEVar4->message,
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                   auStack_6d8,0);
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
                std::__cxx11::string::~string((string *)&error_handler_3);
                std::__cxx11::string::~string((string *)&local_658);
                std::__cxx11::string::~string((string *)&local_1d0);
                if (!bVar1) {
                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                           "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                          );
                  poVar2 = std::operator<<(poVar2,":");
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xd5);
                  poVar2 = std::operator<<(poVar2,": ");
                  poVar2 = std::operator<<(poVar2,"String \"");
                  poVar2 = std::operator<<(poVar2,(string *)
                                                  &error_handler.m_error_list.
                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  message);
                  poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                  combinationError(&local_1f0,first_combination,2);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&error_handler_3,"unexpected instance type",
                             (allocator<char> *)&local_658);
                  operator<<((string *)auStack_6d8,&local_1f0,(string *)&error_handler_3);
                  poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                  poVar2 = std::operator<<(poVar2,"\"");
                  std::endl<char,std::char_traits<char>>(poVar2);
                  std::__cxx11::string::~string((string *)auStack_6d8);
                  std::__cxx11::string::~string((string *)&error_handler_3);
                  std::__cxx11::string::~string((string *)&local_1f0);
                  (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                }
                MyErrorHandler::~MyErrorHandler(&error_handler);
                error_handler.super_error_handler._vptr_error_handler =
                     (_func_int **)&PTR__MyErrorHandler_00162180;
                error_handler.m_error_list.
                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                error_handler.m_error_list.
                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                error_handler.m_error_list.
                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                nlohmann::json_abi_v3_11_2::detail::
                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::json_ref<const_char_(&)[6],_0>
                          ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)auStack_6d8,(char (*) [6])0x1414b4);
                nlohmann::json_abi_v3_11_2::detail::
                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::json_ref<const_char_(&)[7],_0>
                          ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&error_handler_3,(char (*) [7])0x141525);
                nlohmann::json_abi_v3_11_2::detail::
                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::json_ref<const_char_(&)[15],_0>
                          ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&error_handler_3.m_error_list.
                               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char (*) [15])"not-an-integer");
                init_03._M_len = 2;
                init_03._M_array = (iterator)&error_handler_3;
                nlohmann::json_abi_v3_11_2::detail::
                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_638,init_03);
                init_04._M_len = 1;
                init_04._M_array = (iterator)&local_638;
                nlohmann::json_abi_v3_11_2::detail::
                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)(auStack_6d8 + 0x18),init_04);
                init_05._M_len = 2;
                init_05._M_array = (iterator)auStack_6d8;
                nlohmann::json_abi_v3_11_2::detail::
                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_658,init_05);
                init_06._M_len = 1;
                init_06._M_array = (iterator)&local_658;
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::basic_json(&local_618,init_06,true,array);
                validate(&schema,&local_618,&error_handler.super_error_handler);
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_618);
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_658);
                lVar3 = 0x18;
                do {
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)(auStack_6d8 + lVar3));
                  lVar3 = lVar3 + -0x18;
                } while (lVar3 != -0x18);
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_638);
                lVar3 = 0x18;
                do {
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)((long)&error_handler_3.super_error_handler._vptr_error_handler +
                                   lVar3));
                  pEVar4 = error_handler.m_error_list.
                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar3 = lVar3 + -0x18;
                } while (lVar3 != -0x18);
                if ((long)error_handler.m_error_list.
                          super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)error_handler.m_error_list.
                          super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0x1b0) {
                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                           "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                          );
                  poVar2 = std::operator<<(poVar2,":");
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xdd);
                  poVar2 = std::operator<<(poVar2,": ");
                  poVar2 = std::operator<<(poVar2,"The two values of ");
                  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                  poVar2 = std::operator<<(poVar2," (error_list.size()");
                  poVar2 = std::operator<<(poVar2,") and ");
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,6);
                  poVar2 = std::operator<<(poVar2," (6");
                  poVar2 = std::operator<<(poVar2,") should be equal");
                  std::endl<char,std::char_traits<char>>(poVar2);
                  goto LAB_00109b76;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
                nlohmann::json_abi_v3_11_2::
                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&error_handler_3,(string_t *)auStack_6d8);
                bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                  (&pEVar4->ptr,
                                   (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&error_handler_3);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&error_handler_3);
                std::__cxx11::string::~string((string *)auStack_6d8);
                pEVar4 = error_handler.m_error_list.
                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (bVar1) {
                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                           "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                          );
                  poVar2 = std::operator<<(poVar2,":");
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xdf);
                  poVar2 = std::operator<<(poVar2,": ");
                  poVar2 = std::operator<<(poVar2,"The two values of ");
                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                     (poVar2,&(error_handler.m_error_list.
                                               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ptr);
                  poVar2 = std::operator<<(poVar2," (error_list[0].ptr");
                  poVar2 = std::operator<<(poVar2,") and ");
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&error_handler_3,(string_t *)auStack_6d8);
                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                     (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&error_handler_3);
                  poVar2 = std::operator<<(poVar2," (nlohmann::json::json_pointer{\"/first\"}");
                  poVar2 = std::operator<<(poVar2,") should be equal");
                  std::endl<char,std::char_traits<char>>(poVar2);
                }
                else {
                  rootError((string *)&error_handler_3,first_combination,3);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &error_handler_3,0x10);
                  bVar1 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (&pEVar4->message,
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     auStack_6d8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
                  std::__cxx11::string::~string((string *)&error_handler_3);
                  if (!bVar1) {
                    poVar2 = std::operator<<((ostream *)&std::cerr,
                                             "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                            );
                    poVar2 = std::operator<<(poVar2,":");
                    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe0);
                    poVar2 = std::operator<<(poVar2,": ");
                    poVar2 = std::operator<<(poVar2,"String \"");
                    poVar2 = std::operator<<(poVar2,(string *)
                                                    &(error_handler.m_error_list.
                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  message);
                    poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                    rootError((string *)auStack_6d8,first_combination,3);
                    poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                    poVar2 = std::operator<<(poVar2,"\"");
                    std::endl<char,std::char_traits<char>>(poVar2);
                    std::__cxx11::string::~string((string *)auStack_6d8);
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  pEVar4 = error_handler.m_error_list.
                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&error_handler_3,(string_t *)auStack_6d8);
                  bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                    (&pEVar4[1].ptr,
                                     (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&error_handler_3);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&error_handler_3);
                  std::__cxx11::string::~string((string *)auStack_6d8);
                  pEVar4 = error_handler.m_error_list.
                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (bVar1) {
                    poVar2 = std::operator<<((ostream *)&std::cerr,
                                             "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                            );
                    poVar2 = std::operator<<(poVar2,":");
                    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe2);
                    poVar2 = std::operator<<(poVar2,": ");
                    poVar2 = std::operator<<(poVar2,"The two values of ");
                    poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar2,&error_handler.m_error_list.
                                                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                ._M_impl.super__Vector_impl_data._M_start[1].ptr);
                    poVar2 = std::operator<<(poVar2," (error_list[1].ptr");
                    poVar2 = std::operator<<(poVar2,") and ");
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&error_handler_3,(string_t *)auStack_6d8);
                    poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&error_handler_3);
                    poVar2 = std::operator<<(poVar2,
                                             " (nlohmann::json::json_pointer{\"/first/second\"}");
                    poVar2 = std::operator<<(poVar2,") should be equal");
                    std::endl<char,std::char_traits<char>>(poVar2);
                  }
                  else {
                    combinationError(&local_210,first_combination,0);
                    rootError(&local_658,second_combination,2);
                    operator<<((string *)&error_handler_3,&local_210,&local_658);
                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                    basic_regex<std::char_traits<char>,std::allocator<char>>
                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &error_handler_3,0x10);
                    bVar1 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                      (&pEVar4[1].message,
                                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       auStack_6d8,0);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)auStack_6d8);
                    std::__cxx11::string::~string((string *)&error_handler_3);
                    std::__cxx11::string::~string((string *)&local_658);
                    std::__cxx11::string::~string((string *)&local_210);
                    if (!bVar1) {
                      poVar2 = std::operator<<((ostream *)&std::cerr,
                                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                              );
                      poVar2 = std::operator<<(poVar2,":");
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe3);
                      poVar2 = std::operator<<(poVar2,": ");
                      poVar2 = std::operator<<(poVar2,"String \"");
                      poVar2 = std::operator<<(poVar2,(string *)
                                                      &error_handler.m_error_list.
                                                                                                              
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  message);
                      poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                      combinationError(&local_230,first_combination,0);
                      rootError((string *)&error_handler_3,second_combination,2);
                      operator<<((string *)auStack_6d8,&local_230,(string *)&error_handler_3);
                      poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                      poVar2 = std::operator<<(poVar2,"\"");
                      std::endl<char,std::char_traits<char>>(poVar2);
                      std::__cxx11::string::~string((string *)auStack_6d8);
                      std::__cxx11::string::~string((string *)&error_handler_3);
                      std::__cxx11::string::~string((string *)&local_230);
                      (anonymous_namespace)::g_error_count =
                           (anonymous_namespace)::g_error_count + 1;
                    }
                    pEVar4 = error_handler.m_error_list.
                             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658);
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&error_handler_3,(string_t *)auStack_6d8);
                    bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                      (&pEVar4->ptr,
                                       (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&error_handler_3);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&error_handler_3);
                    std::__cxx11::string::~string((string *)auStack_6d8);
                    if (bVar1) {
                      poVar2 = std::operator<<((ostream *)&std::cerr,
                                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                              );
                      poVar2 = std::operator<<(poVar2,":");
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe5);
                      poVar2 = std::operator<<(poVar2,": ");
                      poVar2 = std::operator<<(poVar2,"The two values of ");
                      poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar2,&error_handler.m_error_list.
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].ptr);
                      poVar2 = std::operator<<(poVar2," (error_list[2].ptr");
                      poVar2 = std::operator<<(poVar2,") and ");
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658
                                );
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&error_handler_3,(string_t *)auStack_6d8);
                      poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar2,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                      poVar2 = std::operator<<(poVar2,
                                               " (nlohmann::json::json_pointer{\"/first/second\"}");
                      poVar2 = std::operator<<(poVar2,") should be equal");
                      std::endl<char,std::char_traits<char>>(poVar2);
                    }
                    else {
                      pEVar4 = error_handler.m_error_list.
                               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2;
                      combinationError(&local_270,first_combination,0);
                      combinationError(&local_658,second_combination,0);
                      operator<<(&local_250,&local_270,&local_658);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_638,"unexpected instance type",
                                 (allocator<char> *)&local_618);
                      operator<<((string *)&error_handler_3,&local_250,&local_638);
                      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                      basic_regex<std::char_traits<char>,std::allocator<char>>
                                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&error_handler_3,0x10);
                      bVar1 = std::
                              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                        (&pEVar4->message,
                                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         auStack_6d8,0);
                      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                      ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                   auStack_6d8);
                      std::__cxx11::string::~string((string *)&error_handler_3);
                      std::__cxx11::string::~string((string *)&local_638);
                      std::__cxx11::string::~string((string *)&local_250);
                      std::__cxx11::string::~string((string *)&local_658);
                      std::__cxx11::string::~string((string *)&local_270);
                      if (!bVar1) {
                        poVar2 = std::operator<<((ostream *)&std::cerr,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                );
                        poVar2 = std::operator<<(poVar2,":");
                        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe6);
                        poVar2 = std::operator<<(poVar2,": ");
                        poVar2 = std::operator<<(poVar2,"String \"");
                        poVar2 = std::operator<<(poVar2,(string *)
                                                        &error_handler.m_error_list.
                                                                                                                  
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  message);
                        poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                        combinationError(&local_2b0,first_combination,0);
                        combinationError((string *)&error_handler_3,second_combination,0);
                        operator<<(&local_290,&local_2b0,(string *)&error_handler_3);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_658,"unexpected instance type",
                                   (allocator<char> *)&local_638);
                        operator<<((string *)auStack_6d8,&local_290,&local_658);
                        poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                        poVar2 = std::operator<<(poVar2,"\"");
                        std::endl<char,std::char_traits<char>>(poVar2);
                        std::__cxx11::string::~string((string *)auStack_6d8);
                        std::__cxx11::string::~string((string *)&local_658);
                        std::__cxx11::string::~string((string *)&local_290);
                        std::__cxx11::string::~string((string *)&error_handler_3);
                        std::__cxx11::string::~string((string *)&local_2b0);
                        (anonymous_namespace)::g_error_count =
                             (anonymous_namespace)::g_error_count + 1;
                      }
                      pEVar4 = error_handler.m_error_list.
                               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start + 3;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)auStack_6d8,"/first/second",(allocator<char> *)&local_658
                                );
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&error_handler_3,(string_t *)auStack_6d8);
                      bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                        (&pEVar4->ptr,
                                         (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&error_handler_3);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&error_handler_3);
                      std::__cxx11::string::~string((string *)auStack_6d8);
                      if (bVar1) {
                        poVar2 = std::operator<<((ostream *)&std::cerr,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                );
                        poVar2 = std::operator<<(poVar2,":");
                        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe8);
                        poVar2 = std::operator<<(poVar2,": ");
                        poVar2 = std::operator<<(poVar2,"The two values of ");
                        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                           (poVar2,&error_handler.m_error_list.
                                                                                                        
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].ptr);
                        poVar2 = std::operator<<(poVar2," (error_list[3].ptr");
                        poVar2 = std::operator<<(poVar2,") and ");
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)auStack_6d8,"/first/second",
                                   (allocator<char> *)&local_658);
                        nlohmann::json_abi_v3_11_2::
                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&error_handler_3,(string_t *)auStack_6d8);
                        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                           (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                        poVar2 = std::operator<<(poVar2,
                                                 " (nlohmann::json::json_pointer{\"/first/second\"}"
                                                );
                        poVar2 = std::operator<<(poVar2,") should be equal");
                        std::endl<char,std::char_traits<char>>(poVar2);
                      }
                      else {
                        pEVar4 = error_handler.m_error_list.
                                 super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3;
                        combinationError(&local_2f0,first_combination,0);
                        combinationError(&local_658,second_combination,1);
                        operator<<(&local_2d0,&local_2f0,&local_658);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_638,"unexpected instance type",
                                   (allocator<char> *)&local_618);
                        operator<<((string *)&error_handler_3,&local_2d0,&local_638);
                        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                        basic_regex<std::char_traits<char>,std::allocator<char>>
                                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)auStack_6d8
                                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&error_handler_3,0x10);
                        bVar1 = std::
                                regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                          (&pEVar4->message,
                                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           auStack_6d8,0);
                        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                        ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     auStack_6d8);
                        std::__cxx11::string::~string((string *)&error_handler_3);
                        std::__cxx11::string::~string((string *)&local_638);
                        std::__cxx11::string::~string((string *)&local_2d0);
                        std::__cxx11::string::~string((string *)&local_658);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        if (!bVar1) {
                          poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                          poVar2 = std::operator<<(poVar2,":");
                          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe9);
                          poVar2 = std::operator<<(poVar2,": ");
                          poVar2 = std::operator<<(poVar2,"String \"");
                          poVar2 = std::operator<<(poVar2,(string *)
                                                          &error_handler.m_error_list.
                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  message);
                          poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                          combinationError(&local_330,first_combination,0);
                          combinationError((string *)&error_handler_3,second_combination,1);
                          operator<<(&local_310,&local_330,(string *)&error_handler_3);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_658,"unexpected instance type",
                                     (allocator<char> *)&local_638);
                          operator<<((string *)auStack_6d8,&local_310,&local_658);
                          poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                          poVar2 = std::operator<<(poVar2,"\"");
                          std::endl<char,std::char_traits<char>>(poVar2);
                          std::__cxx11::string::~string((string *)auStack_6d8);
                          std::__cxx11::string::~string((string *)&local_658);
                          std::__cxx11::string::~string((string *)&local_310);
                          std::__cxx11::string::~string((string *)&error_handler_3);
                          std::__cxx11::string::~string((string *)&local_330);
                          (anonymous_namespace)::g_error_count =
                               (anonymous_namespace)::g_error_count + 1;
                        }
                        pEVar4 = error_handler.m_error_list.
                                 super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
                        nlohmann::json_abi_v3_11_2::
                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&error_handler_3,(string_t *)auStack_6d8);
                        bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                          (&pEVar4->ptr,
                                           (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&error_handler_3);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&error_handler_3);
                        std::__cxx11::string::~string((string *)auStack_6d8);
                        if (bVar1) {
                          poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                          poVar2 = std::operator<<(poVar2,":");
                          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xeb);
                          poVar2 = std::operator<<(poVar2,": ");
                          poVar2 = std::operator<<(poVar2,"The two values of ");
                          poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar2,&error_handler.m_error_list.
                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].ptr);
                          poVar2 = std::operator<<(poVar2," (error_list[4].ptr");
                          poVar2 = std::operator<<(poVar2,") and ");
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&error_handler_3,(string_t *)auStack_6d8);
                          poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                          poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                          poVar2 = std::operator<<(poVar2,") should be equal");
                          std::endl<char,std::char_traits<char>>(poVar2);
                        }
                        else {
                          pEVar4 = error_handler.m_error_list.
                                   super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4;
                          combinationError(&local_350,first_combination,1);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_658,"unexpected instance type",
                                     (allocator<char> *)&local_638);
                          operator<<((string *)&error_handler_3,&local_350,&local_658);
                          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                          basic_regex<std::char_traits<char>,std::allocator<char>>
                                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                     auStack_6d8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&error_handler_3,0x10);
                          bVar1 = std::
                                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                            (&pEVar4->message,
                                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )auStack_6d8,0);
                          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                          ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       auStack_6d8);
                          std::__cxx11::string::~string((string *)&error_handler_3);
                          std::__cxx11::string::~string((string *)&local_658);
                          std::__cxx11::string::~string((string *)&local_350);
                          if (!bVar1) {
                            poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                            poVar2 = std::operator<<(poVar2,":");
                            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xec);
                            poVar2 = std::operator<<(poVar2,": ");
                            poVar2 = std::operator<<(poVar2,"String \"");
                            poVar2 = std::operator<<(poVar2,(string *)
                                                            &error_handler.m_error_list.
                                                                                                                          
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  message);
                            poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                            combinationError(&local_370,first_combination,1);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&error_handler_3,"unexpected instance type",
                                       (allocator<char> *)&local_658);
                            operator<<((string *)auStack_6d8,&local_370,(string *)&error_handler_3);
                            poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                            poVar2 = std::operator<<(poVar2,"\"");
                            std::endl<char,std::char_traits<char>>(poVar2);
                            std::__cxx11::string::~string((string *)auStack_6d8);
                            std::__cxx11::string::~string((string *)&error_handler_3);
                            std::__cxx11::string::~string((string *)&local_370);
                            (anonymous_namespace)::g_error_count =
                                 (anonymous_namespace)::g_error_count + 1;
                          }
                          pEVar4 = error_handler.m_error_list.
                                   super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 5;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658);
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&error_handler_3,(string_t *)auStack_6d8);
                          bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                            (&pEVar4->ptr,
                                             (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&error_handler_3);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&error_handler_3);
                          std::__cxx11::string::~string((string *)auStack_6d8);
                          if (bVar1) {
                            poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                            poVar2 = std::operator<<(poVar2,":");
                            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xee);
                            poVar2 = std::operator<<(poVar2,": ");
                            poVar2 = std::operator<<(poVar2,"The two values of ");
                            poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                               (poVar2,&error_handler.m_error_list.
                                                                                                                
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].ptr);
                            poVar2 = std::operator<<(poVar2," (error_list[5].ptr");
                            poVar2 = std::operator<<(poVar2,") and ");
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658)
                            ;
                            nlohmann::json_abi_v3_11_2::
                            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&error_handler_3,(string_t *)auStack_6d8);
                            poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                               (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                            poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                            poVar2 = std::operator<<(poVar2,") should be equal");
                            std::endl<char,std::char_traits<char>>(poVar2);
                          }
                          else {
                            pEVar4 = error_handler.m_error_list.
                                     super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 5;
                            combinationError(&local_390,first_combination,2);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_658,"unexpected instance type",
                                       (allocator<char> *)&local_638);
                            operator<<((string *)&error_handler_3,&local_390,&local_658);
                            std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                            basic_regex<std::char_traits<char>,std::allocator<char>>
                                      ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                       auStack_6d8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&error_handler_3,0x10);
                            bVar1 = std::
                                    regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                              (&pEVar4->message,
                                               (basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                *)auStack_6d8,0);
                            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                            ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         auStack_6d8);
                            std::__cxx11::string::~string((string *)&error_handler_3);
                            std::__cxx11::string::~string((string *)&local_658);
                            std::__cxx11::string::~string((string *)&local_390);
                            if (!bVar1) {
                              poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                              poVar2 = std::operator<<(poVar2,":");
                              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xef);
                              poVar2 = std::operator<<(poVar2,": ");
                              poVar2 = std::operator<<(poVar2,"String \"");
                              poVar2 = std::operator<<(poVar2,(string *)
                                                              &error_handler.m_error_list.
                                                                                                                              
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  message);
                              poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                              combinationError(&local_3b0,first_combination,2);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&error_handler_3,"unexpected instance type",
                                         (allocator<char> *)&local_658);
                              operator<<((string *)auStack_6d8,&local_3b0,(string *)&error_handler_3
                                        );
                              poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                              poVar2 = std::operator<<(poVar2,"\"");
                              std::endl<char,std::char_traits<char>>(poVar2);
                              std::__cxx11::string::~string((string *)auStack_6d8);
                              std::__cxx11::string::~string((string *)&error_handler_3);
                              std::__cxx11::string::~string((string *)&local_3b0);
                              (anonymous_namespace)::g_error_count =
                                   (anonymous_namespace)::g_error_count + 1;
                            }
                            MyErrorHandler::~MyErrorHandler(&error_handler);
                            bVar1 = std::operator==(second_combination,"oneOf");
                            if (!bVar1) {
LAB_0010bd56:
                              error_handler_3.super_error_handler._vptr_error_handler =
                                   (_func_int **)&PTR__MyErrorHandler_00162180;
                              error_handler_3.m_error_list.
                              super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              error_handler_3.m_error_list.
                              super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              error_handler_3.m_error_list.
                              super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              nlohmann::json_abi_v3_11_2::detail::
                              json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::json_ref<const_char_(&)[6],_0>
                                        ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)auStack_6d8,(char (*) [6])0x1414b4);
                              local_638._M_dataplus._M_p._0_4_ = 10;
                              nlohmann::json_abi_v3_11_2::detail::
                              json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::json_ref<int,_0>((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)(auStack_6d8 + 0x18),(int *)&local_638);
                              init_11._M_len = 2;
                              init_11._M_array = (iterator)auStack_6d8;
                              nlohmann::json_abi_v3_11_2::detail::
                              json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&error_handler,init_11);
                              init_12._M_len = 1;
                              init_12._M_array = (iterator)&error_handler;
                              nlohmann::json_abi_v3_11_2::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)&local_658,init_12,true,array);
                              validate(&schema,(json *)&local_658,
                                       &error_handler_3.super_error_handler);
                              nlohmann::json_abi_v3_11_2::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             *)&local_658);
                              nlohmann::json_abi_v3_11_2::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             *)&error_handler);
                              lVar3 = 0x18;
                              do {
                                nlohmann::json_abi_v3_11_2::
                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               *)(auStack_6d8 + lVar3));
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                lVar3 = lVar3 + -0x18;
                              } while (lVar3 != -0x18);
                              if ((long)error_handler_3.m_error_list.
                                        super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)error_handler_3.m_error_list.
                                        super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start != 0x120) {
                                poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                poVar2 = std::operator<<(poVar2,":");
                                poVar2 = (ostream *)
                                         std::ostream::operator<<((ostream *)poVar2,0x10b);
                                poVar2 = std::operator<<(poVar2,": ");
                                poVar2 = std::operator<<(poVar2,"The two values of ");
                                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                                poVar2 = std::operator<<(poVar2," (error_list.size()");
                                poVar2 = std::operator<<(poVar2,") and ");
                                poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,4);
                                poVar2 = std::operator<<(poVar2," (4");
                                poVar2 = std::operator<<(poVar2,") should be equal");
                                std::endl<char,std::char_traits<char>>(poVar2);
                                goto LAB_0010c7eb;
                              }
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)auStack_6d8,"/first",
                                         (allocator<char> *)&local_658);
                              nlohmann::json_abi_v3_11_2::
                              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&error_handler,(string_t *)auStack_6d8);
                              bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                (&pEVar4->ptr,
                                                 (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler);
                              std::__cxx11::string::~string((string *)auStack_6d8);
                              pEVar4 = error_handler_3.m_error_list.
                                       super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              if (bVar1) {
                                poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                poVar2 = std::operator<<(poVar2,":");
                                poVar2 = (ostream *)
                                         std::ostream::operator<<((ostream *)poVar2,0x10d);
                                poVar2 = std::operator<<(poVar2,": ");
                                poVar2 = std::operator<<(poVar2,"The two values of ");
                                poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                   (poVar2,&(error_handler_3.m_error_list.
                                                                                                                          
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ptr);
                                poVar2 = std::operator<<(poVar2," (error_list[0].ptr");
                                poVar2 = std::operator<<(poVar2,") and ");
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)auStack_6d8,"/first",
                                           (allocator<char> *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler,(string_t *)auStack_6d8);
                                poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                   (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                poVar2 = std::operator<<(poVar2,") should be equal");
                                std::endl<char,std::char_traits<char>>(poVar2);
LAB_0010c7d9:
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler);
                                std::__cxx11::string::~string((string *)auStack_6d8);
                              }
                              else {
                                rootError((string *)&error_handler,first_combination,3);
                                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                                basic_regex<std::char_traits<char>,std::allocator<char>>
                                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                           auStack_6d8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&error_handler,0x10);
                                bVar1 = std::
                                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                  (&pEVar4->message,
                                                   (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )auStack_6d8);
                                std::__cxx11::string::~string((string *)&error_handler);
                                if (!bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x10e);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"String \"");
                                  poVar2 = std::operator<<(poVar2,(string *)
                                                                  &(error_handler_3.m_error_list.
                                                                                                                                        
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  message);
                                  poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \""
                                                          );
                                  rootError((string *)auStack_6d8,first_combination,3);
                                  poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                  poVar2 = std::operator<<(poVar2,"\"");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  (anonymous_namespace)::g_error_count =
                                       (anonymous_namespace)::g_error_count + 1;
                                }
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)auStack_6d8,"/first",
                                           (allocator<char> *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler,(string_t *)auStack_6d8);
                                bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                  (&pEVar4[1].ptr,
                                                   (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler);
                                std::__cxx11::string::~string((string *)auStack_6d8);
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                if (bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x110);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"The two values of ");
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,&error_handler_3.m_error_list.
                                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].ptr);
                                  poVar2 = std::operator<<(poVar2," (error_list[1].ptr");
                                  poVar2 = std::operator<<(poVar2,") and ");
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler,(string_t *)auStack_6d8);
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                  poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                  poVar2 = std::operator<<(poVar2,") should be equal");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  goto LAB_0010c7d9;
                                }
                                combinationError(&local_490,first_combination,0);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_658,"unexpected instance type",
                                           (allocator<char> *)&local_638);
                                operator<<((string *)&error_handler,&local_490,&local_658);
                                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                                basic_regex<std::char_traits<char>,std::allocator<char>>
                                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                           auStack_6d8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&error_handler,0x10);
                                bVar1 = std::
                                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                  (&pEVar4[1].message,
                                                   (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )auStack_6d8);
                                std::__cxx11::string::~string((string *)&error_handler);
                                std::__cxx11::string::~string((string *)&local_658);
                                std::__cxx11::string::~string((string *)&local_490);
                                if (!bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x111);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"String \"");
                                  poVar2 = std::operator<<(poVar2,(string *)
                                                                  &error_handler_3.m_error_list.
                                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  message);
                                  poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \""
                                                          );
                                  combinationError(&local_4b0,first_combination,0);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&error_handler,"unexpected instance type",
                                             (allocator<char> *)&local_658);
                                  operator<<((string *)auStack_6d8,&local_4b0,
                                             (string *)&error_handler);
                                  poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                  poVar2 = std::operator<<(poVar2,"\"");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  std::__cxx11::string::~string((string *)&error_handler);
                                  std::__cxx11::string::~string((string *)&local_4b0);
                                  (anonymous_namespace)::g_error_count =
                                       (anonymous_namespace)::g_error_count + 1;
                                }
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)auStack_6d8,"/first",
                                           (allocator<char> *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler,(string_t *)auStack_6d8);
                                bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                  (&pEVar4->ptr,
                                                   (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler);
                                std::__cxx11::string::~string((string *)auStack_6d8);
                                if (bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x113);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"The two values of ");
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,&error_handler_3.m_error_list.
                                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].ptr);
                                  poVar2 = std::operator<<(poVar2," (error_list[2].ptr");
                                  poVar2 = std::operator<<(poVar2,") and ");
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler,(string_t *)auStack_6d8);
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                  poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                  poVar2 = std::operator<<(poVar2,") should be equal");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  goto LAB_0010c7d9;
                                }
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2;
                                combinationError(&local_4d0,first_combination,1);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_658,"instance is below minimum of 20",
                                           (allocator<char> *)&local_638);
                                operator<<((string *)&error_handler,&local_4d0,&local_658);
                                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                                basic_regex<std::char_traits<char>,std::allocator<char>>
                                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                           auStack_6d8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&error_handler,0x10);
                                bVar1 = std::
                                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                  (&pEVar4->message,
                                                   (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )auStack_6d8);
                                std::__cxx11::string::~string((string *)&error_handler);
                                std::__cxx11::string::~string((string *)&local_658);
                                std::__cxx11::string::~string((string *)&local_4d0);
                                if (!bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x114);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"String \"");
                                  poVar2 = std::operator<<(poVar2,(string *)
                                                                  &error_handler_3.m_error_list.
                                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  message);
                                  poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \""
                                                          );
                                  combinationError(&local_4f0,first_combination,1);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&error_handler,
                                             "instance is below minimum of 20",
                                             (allocator<char> *)&local_658);
                                  operator<<((string *)auStack_6d8,&local_4f0,
                                             (string *)&error_handler);
                                  poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                  poVar2 = std::operator<<(poVar2,"\"");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  std::__cxx11::string::~string((string *)&error_handler);
                                  std::__cxx11::string::~string((string *)&local_4f0);
                                  (anonymous_namespace)::g_error_count =
                                       (anonymous_namespace)::g_error_count + 1;
                                }
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 3;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)auStack_6d8,"/first",
                                           (allocator<char> *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler,(string_t *)auStack_6d8);
                                bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                  (&pEVar4->ptr,
                                                   (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler);
                                std::__cxx11::string::~string((string *)auStack_6d8);
                                if (bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x116);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"The two values of ");
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,&error_handler_3.m_error_list.
                                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].ptr);
                                  poVar2 = std::operator<<(poVar2," (error_list[3].ptr");
                                  poVar2 = std::operator<<(poVar2,") and ");
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler,(string_t *)auStack_6d8);
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                  poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                  poVar2 = std::operator<<(poVar2,") should be equal");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  goto LAB_0010c7d9;
                                }
                                pEVar4 = error_handler_3.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 3;
                                combinationError(&local_510,first_combination,2);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_658,"unexpected instance type",
                                           (allocator<char> *)&local_638);
                                operator<<((string *)&error_handler,&local_510,&local_658);
                                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                                basic_regex<std::char_traits<char>,std::allocator<char>>
                                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                           auStack_6d8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&error_handler,0x10);
                                bVar1 = std::
                                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                  (&pEVar4->message,
                                                   (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )auStack_6d8);
                                std::__cxx11::string::~string((string *)&error_handler);
                                std::__cxx11::string::~string((string *)&local_658);
                                std::__cxx11::string::~string((string *)&local_510);
                                if (!bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x117);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"String \"");
                                  poVar2 = std::operator<<(poVar2,(string *)
                                                                  &error_handler_3.m_error_list.
                                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  message);
                                  poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \""
                                                          );
                                  combinationError(&local_530,first_combination,2);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&error_handler,"unexpected instance type",
                                             (allocator<char> *)&local_658);
                                  operator<<((string *)auStack_6d8,&local_530,
                                             (string *)&error_handler);
                                  poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                  poVar2 = std::operator<<(poVar2,"\"");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  std::__cxx11::string::~string((string *)&error_handler);
                                  std::__cxx11::string::~string((string *)&local_530);
                                  (anonymous_namespace)::g_error_count =
                                       (anonymous_namespace)::g_error_count + 1;
                                }
                                MyErrorHandler::~MyErrorHandler(&error_handler_3);
                                error_handler_3.super_error_handler._vptr_error_handler =
                                     (_func_int **)&PTR__MyErrorHandler_00162180;
                                error_handler_3.m_error_list.
                                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                error_handler_3.m_error_list.
                                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                error_handler_3.m_error_list.
                                super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                nlohmann::json_abi_v3_11_2::detail::
                                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::json_ref<const_char_(&)[6],_0>
                                          ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)auStack_6d8,(char (*) [6])0x1414b4);
                                nlohmann::json_abi_v3_11_2::detail::
                                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::json_ref<const_char_(&)[6],_0>
                                          ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)(auStack_6d8 + 0x18),(char (*) [6])"short");
                                init_13._M_len = 2;
                                init_13._M_array = (iterator)auStack_6d8;
                                nlohmann::json_abi_v3_11_2::detail::
                                json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&error_handler,init_13);
                                init_14._M_len = 1;
                                init_14._M_array = (iterator)&error_handler;
                                nlohmann::json_abi_v3_11_2::
                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)&local_658,init_14,true,array);
                                validate(&schema,(json *)&local_658,
                                         &error_handler_3.super_error_handler);
                                nlohmann::json_abi_v3_11_2::
                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               *)&error_handler);
                                lVar3 = 0x18;
                                do {
                                  nlohmann::json_abi_v3_11_2::
                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                 *)(auStack_6d8 + lVar3));
                                  pEVar4 = error_handler_3.m_error_list.
                                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  lVar3 = lVar3 + -0x18;
                                } while (lVar3 != -0x18);
                                if ((long)error_handler_3.m_error_list.
                                          super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)error_handler_3.m_error_list.
                                          super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_start == 0x120) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler,(string_t *)auStack_6d8);
                                  bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                    (&pEVar4->ptr,
                                                     (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&error_handler);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  pEVar4 = error_handler_3.m_error_list.
                                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  if (bVar1) {
                                    poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                    poVar2 = std::operator<<(poVar2,":");
                                    poVar2 = (ostream *)
                                             std::ostream::operator<<((ostream *)poVar2,0x121);
                                    poVar2 = std::operator<<(poVar2,": ");
                                    poVar2 = std::operator<<(poVar2,"The two values of ");
                                    poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                       (poVar2,&(error_handler_3.m_error_list.
                                                                                                                                  
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ptr);
                                    poVar2 = std::operator<<(poVar2," (error_list[0].ptr");
                                    poVar2 = std::operator<<(poVar2,") and ");
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)auStack_6d8,"/first",
                                               (allocator<char> *)&local_658);
                                    nlohmann::json_abi_v3_11_2::
                                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&error_handler,(string_t *)auStack_6d8);
                                    poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                       (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                    poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                    poVar2 = std::operator<<(poVar2,") should be equal");
                                    std::endl<char,std::char_traits<char>>(poVar2);
                                  }
                                  else {
                                    rootError((string *)&error_handler,first_combination,3);
                                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>
                                    ::basic_regex<std::char_traits<char>,std::allocator<char>>
                                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *
                                               )auStack_6d8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&error_handler,0x10);
                                    bVar1 = std::
                                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                      (&pEVar4->message,
                                                       (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                    std::__cxx11::
                                    basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                    ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8);
                                    std::__cxx11::string::~string((string *)&error_handler);
                                    if (!bVar1) {
                                      poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                      poVar2 = std::operator<<(poVar2,":");
                                      poVar2 = (ostream *)
                                               std::ostream::operator<<((ostream *)poVar2,0x122);
                                      poVar2 = std::operator<<(poVar2,": ");
                                      poVar2 = std::operator<<(poVar2,"String \"");
                                      poVar2 = std::operator<<(poVar2,(string *)
                                                                      &(error_handler_3.m_error_list
                                                                        .
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  message);
                                      poVar2 = std::operator<<(poVar2,
                                                  "\" doesn\'t match with regex: \"");
                                      rootError((string *)auStack_6d8,first_combination,3);
                                      poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                      poVar2 = std::operator<<(poVar2,"\"");
                                      std::endl<char,std::char_traits<char>>(poVar2);
                                      std::__cxx11::string::~string((string *)auStack_6d8);
                                      (anonymous_namespace)::g_error_count =
                                           (anonymous_namespace)::g_error_count + 1;
                                    }
                                    pEVar4 = error_handler_3.m_error_list.
                                             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)auStack_6d8,"/first",
                                               (allocator<char> *)&local_658);
                                    nlohmann::json_abi_v3_11_2::
                                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&error_handler,(string_t *)auStack_6d8);
                                    bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                      (&pEVar4[1].ptr,
                                                       (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&error_handler);
                                    std::__cxx11::string::~string((string *)auStack_6d8);
                                    pEVar4 = error_handler_3.m_error_list.
                                             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                    if (bVar1) {
                                      poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                      poVar2 = std::operator<<(poVar2,":");
                                      poVar2 = (ostream *)
                                               std::ostream::operator<<((ostream *)poVar2,0x124);
                                      poVar2 = std::operator<<(poVar2,": ");
                                      poVar2 = std::operator<<(poVar2,"The two values of ");
                                      poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                         (poVar2,&error_handler_3.m_error_list.
                                                                                                                                    
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].ptr);
                                      poVar2 = std::operator<<(poVar2," (error_list[1].ptr");
                                      poVar2 = std::operator<<(poVar2,") and ");
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)auStack_6d8,"/first",
                                                 (allocator<char> *)&local_658);
                                      nlohmann::json_abi_v3_11_2::
                                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&error_handler,(string_t *)auStack_6d8);
                                      poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                         (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                      poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                      poVar2 = std::operator<<(poVar2,") should be equal");
                                      std::endl<char,std::char_traits<char>>(poVar2);
                                    }
                                    else {
                                      combinationError(&local_550,first_combination,0);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_658,"unexpected instance type",
                                                 (allocator<char> *)&local_638);
                                      operator<<((string *)&error_handler,&local_550,&local_658);
                                      std::__cxx11::
                                      basic_regex<char,std::__cxx11::regex_traits<char>>::
                                      basic_regex<std::char_traits<char>,std::allocator<char>>
                                                ((basic_regex<char,std::__cxx11::regex_traits<char>>
                                                  *)auStack_6d8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&error_handler,0x10);
                                      bVar1 = std::
                                              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                        (&pEVar4[1].message,
                                                         (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                      std::__cxx11::
                                      basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                      ~basic_regex((
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8);
                                      std::__cxx11::string::~string((string *)&error_handler);
                                      std::__cxx11::string::~string((string *)&local_658);
                                      std::__cxx11::string::~string((string *)&local_550);
                                      if (!bVar1) {
                                        poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                        poVar2 = std::operator<<(poVar2,":");
                                        poVar2 = (ostream *)
                                                 std::ostream::operator<<((ostream *)poVar2,0x125);
                                        poVar2 = std::operator<<(poVar2,": ");
                                        poVar2 = std::operator<<(poVar2,"String \"");
                                        poVar2 = std::operator<<(poVar2,(string *)
                                                                        &error_handler_3.
                                                                         m_error_list.
                                                                                                                                                  
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  message);
                                        poVar2 = std::operator<<(poVar2,
                                                  "\" doesn\'t match with regex: \"");
                                        combinationError(&local_570,first_combination,0);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&error_handler,
                                                   "unexpected instance type",
                                                   (allocator<char> *)&local_658);
                                        operator<<((string *)auStack_6d8,&local_570,
                                                   (string *)&error_handler);
                                        poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                        poVar2 = std::operator<<(poVar2,"\"");
                                        std::endl<char,std::char_traits<char>>(poVar2);
                                        std::__cxx11::string::~string((string *)auStack_6d8);
                                        std::__cxx11::string::~string((string *)&error_handler);
                                        std::__cxx11::string::~string((string *)&local_570);
                                        (anonymous_namespace)::g_error_count =
                                             (anonymous_namespace)::g_error_count + 1;
                                      }
                                      pEVar4 = error_handler_3.m_error_list.
                                               super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 2;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)auStack_6d8,"/first",
                                                 (allocator<char> *)&local_658);
                                      nlohmann::json_abi_v3_11_2::
                                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&error_handler,(string_t *)auStack_6d8);
                                      bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                        (&pEVar4->ptr,
                                                         (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&error_handler);
                                      std::__cxx11::string::~string((string *)auStack_6d8);
                                      if (bVar1) {
                                        poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                        poVar2 = std::operator<<(poVar2,":");
                                        poVar2 = (ostream *)
                                                 std::ostream::operator<<((ostream *)poVar2,0x127);
                                        poVar2 = std::operator<<(poVar2,": ");
                                        poVar2 = std::operator<<(poVar2,"The two values of ");
                                        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                           (poVar2,&error_handler_3.m_error_list.
                                                                                                                                        
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].ptr);
                                        poVar2 = std::operator<<(poVar2," (error_list[2].ptr");
                                        poVar2 = std::operator<<(poVar2,") and ");
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)auStack_6d8,"/first",
                                                   (allocator<char> *)&local_658);
                                        nlohmann::json_abi_v3_11_2::
                                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&error_handler,(string_t *)auStack_6d8);
                                        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                           (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                        poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                        poVar2 = std::operator<<(poVar2,") should be equal");
                                        std::endl<char,std::char_traits<char>>(poVar2);
                                      }
                                      else {
                                        pEVar4 = error_handler_3.m_error_list.
                                                 super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 2;
                                        combinationError(&local_590,first_combination,1);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_658,"unexpected instance type",
                                                   (allocator<char> *)&local_638);
                                        operator<<((string *)&error_handler,&local_590,&local_658);
                                        std::__cxx11::
                                        basic_regex<char,std::__cxx11::regex_traits<char>>::
                                        basic_regex<std::char_traits<char>,std::allocator<char>>
                                                  ((
                                                  basic_regex<char,std::__cxx11::regex_traits<char>>
                                                  *)auStack_6d8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&error_handler,0x10);
                                        bVar1 = std::
                                                regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                          (&pEVar4->message,
                                                           (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                        std::__cxx11::
                                        basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                        ~basic_regex((
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8);
                                        std::__cxx11::string::~string((string *)&error_handler);
                                        std::__cxx11::string::~string((string *)&local_658);
                                        std::__cxx11::string::~string((string *)&local_590);
                                        if (!bVar1) {
                                          poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                          poVar2 = std::operator<<(poVar2,":");
                                          poVar2 = (ostream *)
                                                   std::ostream::operator<<((ostream *)poVar2,0x128)
                                          ;
                                          poVar2 = std::operator<<(poVar2,": ");
                                          poVar2 = std::operator<<(poVar2,"String \"");
                                          poVar2 = std::operator<<(poVar2,(string *)
                                                                          &error_handler_3.
                                                                           m_error_list.
                                                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  message);
                                          poVar2 = std::operator<<(poVar2,
                                                  "\" doesn\'t match with regex: \"");
                                          combinationError(&local_5b0,first_combination,1);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&error_handler,
                                                     "unexpected instance type",
                                                     (allocator<char> *)&local_658);
                                          operator<<((string *)auStack_6d8,&local_5b0,
                                                     (string *)&error_handler);
                                          poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                          poVar2 = std::operator<<(poVar2,"\"");
                                          std::endl<char,std::char_traits<char>>(poVar2);
                                          std::__cxx11::string::~string((string *)auStack_6d8);
                                          std::__cxx11::string::~string((string *)&error_handler);
                                          std::__cxx11::string::~string((string *)&local_5b0);
                                          (anonymous_namespace)::g_error_count =
                                               (anonymous_namespace)::g_error_count + 1;
                                        }
                                        pEVar4 = error_handler_3.m_error_list.
                                                 super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 3;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)auStack_6d8,"/first",
                                                   (allocator<char> *)&local_658);
                                        nlohmann::json_abi_v3_11_2::
                                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&error_handler,(string_t *)auStack_6d8);
                                        bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                          (&pEVar4->ptr,
                                                           (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&error_handler);
                                        std::__cxx11::string::~string((string *)auStack_6d8);
                                        if (!bVar1) {
                                          pEVar4 = error_handler_3.m_error_list.
                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 3;
                                          combinationError(&local_5d0,first_combination,2);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_658,
                                                     "instance is too short as per minLength:10",
                                                     (allocator<char> *)&local_638);
                                          operator<<((string *)&error_handler,&local_5d0,&local_658)
                                          ;
                                          std::__cxx11::
                                          basic_regex<char,std::__cxx11::regex_traits<char>>::
                                          basic_regex<std::char_traits<char>,std::allocator<char>>
                                                    ((
                                                  basic_regex<char,std::__cxx11::regex_traits<char>>
                                                  *)auStack_6d8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&error_handler,0x10);
                                          bVar1 = std::
                                                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                            (&pEVar4->message,
                                                             (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                          std::__cxx11::
                                          basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                          ~basic_regex((
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8);
                                          std::__cxx11::string::~string((string *)&error_handler);
                                          std::__cxx11::string::~string((string *)&local_658);
                                          std::__cxx11::string::~string((string *)&local_5d0);
                                          if (!bVar1) {
                                            poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                            poVar2 = std::operator<<(poVar2,":");
                                            poVar2 = (ostream *)
                                                     std::ostream::operator<<((ostream *)poVar2,299)
                                            ;
                                            poVar2 = std::operator<<(poVar2,": ");
                                            poVar2 = std::operator<<(poVar2,"String \"");
                                            poVar2 = std::operator<<(poVar2,(string *)
                                                                            &error_handler_3.
                                                                             m_error_list.
                                                                                                                                                          
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  message);
                                            poVar2 = std::operator<<(poVar2,
                                                  "\" doesn\'t match with regex: \"");
                                            combinationError(&local_5f0,first_combination,2);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&error_handler,
                                                       "instance is too short as per minLength:10",
                                                       (allocator<char> *)&local_658);
                                            operator<<((string *)auStack_6d8,&local_5f0,
                                                       (string *)&error_handler);
                                            poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                            poVar2 = std::operator<<(poVar2,"\"");
                                            std::endl<char,std::char_traits<char>>(poVar2);
                                            std::__cxx11::string::~string((string *)auStack_6d8);
                                            std::__cxx11::string::~string((string *)&error_handler);
                                            std::__cxx11::string::~string((string *)&local_5f0);
                                            (anonymous_namespace)::g_error_count =
                                                 (anonymous_namespace)::g_error_count + 1;
                                          }
                                          goto LAB_0010c7eb;
                                        }
                                        poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                        poVar2 = std::operator<<(poVar2,":");
                                        poVar2 = (ostream *)
                                                 std::ostream::operator<<((ostream *)poVar2,0x12a);
                                        poVar2 = std::operator<<(poVar2,": ");
                                        poVar2 = std::operator<<(poVar2,"The two values of ");
                                        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                           (poVar2,&error_handler_3.m_error_list.
                                                                                                                                        
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].ptr);
                                        poVar2 = std::operator<<(poVar2," (error_list[3].ptr");
                                        poVar2 = std::operator<<(poVar2,") and ");
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)auStack_6d8,"/first",
                                                   (allocator<char> *)&local_658);
                                        nlohmann::json_abi_v3_11_2::
                                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&error_handler,(string_t *)auStack_6d8);
                                        poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                           (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler);
                                        poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                        poVar2 = std::operator<<(poVar2,") should be equal");
                                        std::endl<char,std::char_traits<char>>(poVar2);
                                      }
                                    }
                                  }
                                  goto LAB_0010c7d9;
                                }
                                poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                poVar2 = std::operator<<(poVar2,":");
                                poVar2 = (ostream *)
                                         std::ostream::operator<<((ostream *)poVar2,0x11f);
                                poVar2 = std::operator<<(poVar2,": ");
                                poVar2 = std::operator<<(poVar2,"The two values of ");
                                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                                poVar2 = std::operator<<(poVar2," (error_list.size()");
                                poVar2 = std::operator<<(poVar2,") and ");
                                poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,4);
                                poVar2 = std::operator<<(poVar2," (4");
                                poVar2 = std::operator<<(poVar2,") should be equal");
                                std::endl<char,std::char_traits<char>>(poVar2);
                              }
LAB_0010c7eb:
                              this = &error_handler_3;
                              goto LAB_00109b7b;
                            }
                            error_handler.super_error_handler._vptr_error_handler =
                                 (_func_int **)&PTR__MyErrorHandler_00162180;
                            error_handler.m_error_list.
                            super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            error_handler.m_error_list.
                            super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            error_handler.m_error_list.
                            super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            nlohmann::json_abi_v3_11_2::detail::
                            json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::json_ref<const_char_(&)[6],_0>
                                      ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)auStack_6d8,(char (*) [6])0x1414b4);
                            nlohmann::json_abi_v3_11_2::detail::
                            json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::json_ref<const_char_(&)[7],_0>
                                      ((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&error_handler_3,(char (*) [7])0x141525);
                            local_5f4 = 8;
                            nlohmann::json_abi_v3_11_2::detail::
                            json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::json_ref<int,_0>((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                *)&error_handler_3.m_error_list.
                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               ,&local_5f4);
                            init_07._M_len = 2;
                            init_07._M_array = (iterator)&error_handler_3;
                            nlohmann::json_abi_v3_11_2::detail::
                            json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_638,init_07);
                            init_08._M_len = 1;
                            init_08._M_array = (iterator)&local_638;
                            nlohmann::json_abi_v3_11_2::detail::
                            json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)(auStack_6d8 + 0x18),init_08);
                            init_09._M_len = 2;
                            init_09._M_array = (iterator)auStack_6d8;
                            nlohmann::json_abi_v3_11_2::detail::
                            json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::json_ref((json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_658,init_09);
                            init_10._M_len = 1;
                            init_10._M_array = (iterator)&local_658;
                            nlohmann::json_abi_v3_11_2::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::basic_json(&local_618,init_10,true,array);
                            validate(&schema,&local_618,&error_handler.super_error_handler);
                            nlohmann::json_abi_v3_11_2::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::~basic_json(&local_618);
                            nlohmann::json_abi_v3_11_2::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           *)&local_658);
                            lVar3 = 0x18;
                            do {
                              nlohmann::json_abi_v3_11_2::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             *)(auStack_6d8 + lVar3));
                              lVar3 = lVar3 + -0x18;
                            } while (lVar3 != -0x18);
                            nlohmann::json_abi_v3_11_2::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           *)&local_638);
                            lVar3 = 0x18;
                            do {
                              nlohmann::json_abi_v3_11_2::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             *)((long)&error_handler_3.super_error_handler.
                                                       _vptr_error_handler + lVar3));
                              pEVar4 = error_handler.m_error_list.
                                       super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              lVar3 = lVar3 + -0x18;
                            } while (lVar3 != -0x18);
                            if ((long)error_handler.m_error_list.
                                      super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)error_handler.m_error_list.
                                      super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_start != 0x120) {
                              poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                              poVar2 = std::operator<<(poVar2,":");
                              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf7);
                              poVar2 = std::operator<<(poVar2,": ");
                              poVar2 = std::operator<<(poVar2,"The two values of ");
                              poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                              poVar2 = std::operator<<(poVar2," (error_list.size()");
                              poVar2 = std::operator<<(poVar2,") and ");
                              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,4);
                              poVar2 = std::operator<<(poVar2," (4");
                              poVar2 = std::operator<<(poVar2,") should be equal");
                              std::endl<char,std::char_traits<char>>(poVar2);
                              goto LAB_00109b76;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)auStack_6d8,"/first",(allocator<char> *)&local_658)
                            ;
                            nlohmann::json_abi_v3_11_2::
                            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&error_handler_3,(string_t *)auStack_6d8);
                            bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                              (&pEVar4->ptr,
                                               (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&error_handler_3);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&error_handler_3);
                            std::__cxx11::string::~string((string *)auStack_6d8);
                            pEVar4 = error_handler.m_error_list.
                                     super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            if (bVar1) {
                              poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                              poVar2 = std::operator<<(poVar2,":");
                              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf9);
                              poVar2 = std::operator<<(poVar2,": ");
                              poVar2 = std::operator<<(poVar2,"The two values of ");
                              poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                 (poVar2,&(error_handler.m_error_list.
                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ptr);
                              poVar2 = std::operator<<(poVar2," (error_list[0].ptr");
                              poVar2 = std::operator<<(poVar2,") and ");
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)auStack_6d8,"/first",
                                         (allocator<char> *)&local_658);
                              nlohmann::json_abi_v3_11_2::
                              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&error_handler_3,(string_t *)auStack_6d8);
                              poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                 (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                              poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                              poVar2 = std::operator<<(poVar2,") should be equal");
                              std::endl<char,std::char_traits<char>>(poVar2);
                            }
                            else {
                              rootError((string *)&error_handler_3,first_combination,3);
                              std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                              basic_regex<std::char_traits<char>,std::allocator<char>>
                                        ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                         auStack_6d8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&error_handler_3,0x10);
                              bVar1 = std::
                                      regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                (&pEVar4->message,
                                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                              ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           auStack_6d8);
                              std::__cxx11::string::~string((string *)&error_handler_3);
                              if (!bVar1) {
                                poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                poVar2 = std::operator<<(poVar2,":");
                                poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xfa)
                                ;
                                poVar2 = std::operator<<(poVar2,": ");
                                poVar2 = std::operator<<(poVar2,"String \"");
                                poVar2 = std::operator<<(poVar2,(string *)
                                                                &(error_handler.m_error_list.
                                                                                                                                    
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  message);
                                poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \"");
                                rootError((string *)auStack_6d8,first_combination,3);
                                poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                poVar2 = std::operator<<(poVar2,"\"");
                                std::endl<char,std::char_traits<char>>(poVar2);
                                std::__cxx11::string::~string((string *)auStack_6d8);
                                (anonymous_namespace)::g_error_count =
                                     (anonymous_namespace)::g_error_count + 1;
                              }
                              pEVar4 = error_handler.m_error_list.
                                       super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)auStack_6d8,"/first/second",
                                         (allocator<char> *)&local_658);
                              nlohmann::json_abi_v3_11_2::
                              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&error_handler_3,(string_t *)auStack_6d8);
                              bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                (&pEVar4[1].ptr,
                                                 (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler_3);
                              std::__cxx11::string::~string((string *)auStack_6d8);
                              pEVar4 = error_handler.m_error_list.
                                       super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              if (bVar1) {
                                poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                poVar2 = std::operator<<(poVar2,":");
                                poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xfc)
                                ;
                                poVar2 = std::operator<<(poVar2,": ");
                                poVar2 = std::operator<<(poVar2,"The two values of ");
                                poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                   (poVar2,&error_handler.m_error_list.
                                                                                                                        
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].ptr);
                                poVar2 = std::operator<<(poVar2," (error_list[1].ptr");
                                poVar2 = std::operator<<(poVar2,") and ");
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)auStack_6d8,"/first/second",
                                           (allocator<char> *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler_3,(string_t *)auStack_6d8);
                                poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                   (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                                poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first/second\"}"
                                                  );
                                poVar2 = std::operator<<(poVar2,") should be equal");
                                std::endl<char,std::char_traits<char>>(poVar2);
                              }
                              else {
                                combinationError(&local_3d0,first_combination,0);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_658,
                                           "more than one subschema has succeeded, but exactly one of them is required to validate"
                                           ,(allocator<char> *)&local_638);
                                operator<<((string *)&error_handler_3,&local_3d0,&local_658);
                                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                                basic_regex<std::char_traits<char>,std::allocator<char>>
                                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                           auStack_6d8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&error_handler_3,0x10);
                                bVar1 = std::
                                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                  (&pEVar4[1].message,
                                                   (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )auStack_6d8);
                                std::__cxx11::string::~string((string *)&error_handler_3);
                                std::__cxx11::string::~string((string *)&local_658);
                                std::__cxx11::string::~string((string *)&local_3d0);
                                if (!bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0xfd);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"String \"");
                                  poVar2 = std::operator<<(poVar2,(string *)
                                                                  &error_handler.m_error_list.
                                                                                                                                      
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  message);
                                  poVar2 = std::operator<<(poVar2,"\" doesn\'t match with regex: \""
                                                          );
                                  combinationError(&local_3f0,first_combination,0);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&error_handler_3,
                                             "more than one subschema has succeeded, but exactly one of them is required to validate"
                                             ,(allocator<char> *)&local_658);
                                  operator<<((string *)auStack_6d8,&local_3f0,
                                             (string *)&error_handler_3);
                                  poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                  poVar2 = std::operator<<(poVar2,"\"");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  std::__cxx11::string::~string((string *)&error_handler_3);
                                  std::__cxx11::string::~string((string *)&local_3f0);
                                  (anonymous_namespace)::g_error_count =
                                       (anonymous_namespace)::g_error_count + 1;
                                }
                                pEVar4 = error_handler.m_error_list.
                                         super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)auStack_6d8,"/first",
                                           (allocator<char> *)&local_658);
                                nlohmann::json_abi_v3_11_2::
                                json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&error_handler_3,(string_t *)auStack_6d8);
                                bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                  (&pEVar4->ptr,
                                                   (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler_3);
                                std::__cxx11::string::~string((string *)auStack_6d8);
                                if (bVar1) {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0xff);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"The two values of ");
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,&error_handler.m_error_list.
                                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].ptr);
                                  poVar2 = std::operator<<(poVar2," (error_list[2].ptr");
                                  poVar2 = std::operator<<(poVar2,") and ");
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler_3,(string_t *)auStack_6d8);
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                                  poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                  poVar2 = std::operator<<(poVar2,") should be equal");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                }
                                else {
                                  pEVar4 = error_handler.m_error_list.
                                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 2;
                                  combinationError(&local_410,first_combination,1);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_658,"unexpected instance type",
                                             (allocator<char> *)&local_638);
                                  operator<<((string *)&error_handler_3,&local_410,&local_658);
                                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                                  basic_regex<std::char_traits<char>,std::allocator<char>>
                                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                             auStack_6d8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&error_handler_3,0x10);
                                  bVar1 = std::
                                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                    (&pEVar4->message,
                                                     (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                  ::~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8);
                                  std::__cxx11::string::~string((string *)&error_handler_3);
                                  std::__cxx11::string::~string((string *)&local_658);
                                  std::__cxx11::string::~string((string *)&local_410);
                                  if (!bVar1) {
                                    poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                    poVar2 = std::operator<<(poVar2,":");
                                    poVar2 = (ostream *)
                                             std::ostream::operator<<((ostream *)poVar2,0x100);
                                    poVar2 = std::operator<<(poVar2,": ");
                                    poVar2 = std::operator<<(poVar2,"String \"");
                                    poVar2 = std::operator<<(poVar2,(string *)
                                                                    &error_handler.m_error_list.
                                                                                                                                          
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  message);
                                    poVar2 = std::operator<<(poVar2,
                                                  "\" doesn\'t match with regex: \"");
                                    combinationError(&local_430,first_combination,1);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&error_handler_3,"unexpected instance type"
                                               ,(allocator<char> *)&local_658);
                                    operator<<((string *)auStack_6d8,&local_430,
                                               (string *)&error_handler_3);
                                    poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                    poVar2 = std::operator<<(poVar2,"\"");
                                    std::endl<char,std::char_traits<char>>(poVar2);
                                    std::__cxx11::string::~string((string *)auStack_6d8);
                                    std::__cxx11::string::~string((string *)&error_handler_3);
                                    std::__cxx11::string::~string((string *)&local_430);
                                    (anonymous_namespace)::g_error_count =
                                         (anonymous_namespace)::g_error_count + 1;
                                  }
                                  pEVar4 = error_handler.m_error_list.
                                           super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 3;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler_3,(string_t *)auStack_6d8);
                                  bVar1 = nlohmann::json_abi_v3_11_2::operator!=
                                                    (&pEVar4->ptr,
                                                     (
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&error_handler_3);
                                  std::__cxx11::string::~string((string *)auStack_6d8);
                                  if (!bVar1) {
                                    pEVar4 = error_handler.m_error_list.
                                             super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 3;
                                    combinationError(&local_450,first_combination,2);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_658,"unexpected instance type",
                                               (allocator<char> *)&local_638);
                                    operator<<((string *)&error_handler_3,&local_450,&local_658);
                                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>
                                    ::basic_regex<std::char_traits<char>,std::allocator<char>>
                                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *
                                               )auStack_6d8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&error_handler_3,0x10);
                                    bVar1 = std::
                                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                      (&pEVar4->message,
                                                       (
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8,0);
                                    std::__cxx11::
                                    basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                    ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)auStack_6d8);
                                    std::__cxx11::string::~string((string *)&error_handler_3);
                                    std::__cxx11::string::~string((string *)&local_658);
                                    std::__cxx11::string::~string((string *)&local_450);
                                    if (!bVar1) {
                                      poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                      poVar2 = std::operator<<(poVar2,":");
                                      poVar2 = (ostream *)
                                               std::ostream::operator<<((ostream *)poVar2,0x103);
                                      poVar2 = std::operator<<(poVar2,": ");
                                      poVar2 = std::operator<<(poVar2,"String \"");
                                      poVar2 = std::operator<<(poVar2,(string *)
                                                                      &error_handler.m_error_list.
                                                                                                                                              
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  message);
                                      poVar2 = std::operator<<(poVar2,
                                                  "\" doesn\'t match with regex: \"");
                                      combinationError(&local_470,first_combination,2);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&error_handler_3,
                                                 "unexpected instance type",
                                                 (allocator<char> *)&local_658);
                                      operator<<((string *)auStack_6d8,&local_470,
                                                 (string *)&error_handler_3);
                                      poVar2 = std::operator<<(poVar2,(string *)auStack_6d8);
                                      poVar2 = std::operator<<(poVar2,"\"");
                                      std::endl<char,std::char_traits<char>>(poVar2);
                                      std::__cxx11::string::~string((string *)auStack_6d8);
                                      std::__cxx11::string::~string((string *)&error_handler_3);
                                      std::__cxx11::string::~string((string *)&local_470);
                                      (anonymous_namespace)::g_error_count =
                                           (anonymous_namespace)::g_error_count + 1;
                                    }
                                    MyErrorHandler::~MyErrorHandler(&error_handler);
                                    goto LAB_0010bd56;
                                  }
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                                  );
                                  poVar2 = std::operator<<(poVar2,":");
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar2,0x102);
                                  poVar2 = std::operator<<(poVar2,": ");
                                  poVar2 = std::operator<<(poVar2,"The two values of ");
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,&error_handler.m_error_list.
                                                                                                                            
                                                  super__Vector_base<(anonymous_namespace)::MyErrorHandler::ErrorEntry,_std::allocator<(anonymous_namespace)::MyErrorHandler::ErrorEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].ptr);
                                  poVar2 = std::operator<<(poVar2," (error_list[3].ptr");
                                  poVar2 = std::operator<<(poVar2,") and ");
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_6d8,"/first",
                                             (allocator<char> *)&local_658);
                                  nlohmann::json_abi_v3_11_2::
                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&error_handler_3,(string_t *)auStack_6d8);
                                  poVar2 = nlohmann::json_abi_v3_11_2::operator<<
                                                     (poVar2,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&error_handler_3);
                                  poVar2 = std::operator<<(poVar2,
                                                  " (nlohmann::json::json_pointer{\"/first\"}");
                                  poVar2 = std::operator<<(poVar2,") should be equal");
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&error_handler_3);
    std::__cxx11::string::~string((string *)auStack_6d8);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc3);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"The two values of ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," (error_list.size()");
    poVar2 = std::operator<<(poVar2,") and ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,6);
    poVar2 = std::operator<<(poVar2," (6");
    poVar2 = std::operator<<(poVar2,") should be equal");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
LAB_00109b76:
  this = &error_handler;
LAB_00109b7b:
  MyErrorHandler::~MyErrorHandler(this);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&schema);
  return;
}

Assistant:

auto verboseTest(const std::string &first_combination, const std::string &second_combination) -> void
{
	const nlohmann::json schema = generateSchema(first_combination, second_combination);

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", {{"second", 1}}}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 6);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << rootError(second_combination, 2));

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 0) << combinationError(second_combination, 0) << "instance is below minimum of 5");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 0) << combinationError(second_combination, 1) << "instance is not a multiple of 2.0");

		EXPECT_EQ(error_list[4].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[4].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[5].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[5].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", {{"second", "not-an-integer"}}}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 6);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << rootError(second_combination, 2));

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 0) << combinationError(second_combination, 0) << "unexpected instance type");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 0) << combinationError(second_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[4].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[4].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[5].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[5].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	if (second_combination == "oneOf") {
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", {{"second", 8}}}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 4);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << "more than one subschema has succeeded, but exactly one of them is required to validate");

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", 10}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 4);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << "unexpected instance type");

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 1) << "instance is below minimum of 20");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", "short"}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 4);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << "unexpected instance type");

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 2) << "instance is too short as per minLength:10");
	}
}